

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::GPUConversionDecodeEnabledCase::setupTest
          (GPUConversionDecodeEnabledCase *this)

{
  int height;
  string *in_RCX;
  ComparisonFunction *paramsComparisonFunction;
  Vec4 *color;
  WrapMode wrapS;
  FragmentShaderParameters shaderParameters;
  ComparisonFunction comparisonFunction;
  WrapMode wrapT;
  undefined1 *puVar1;
  FilterMode in_stack_fffffffffffffee0;
  FilterMode in_stack_fffffffffffffee8;
  undefined4 uStack_114;
  SRGBDecode in_stack_fffffffffffffef0;
  undefined1 local_108 [128];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  ComparisonFunction local_60;
  
  local_108._0_8_ = local_108 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"srgbToLinearCheck","");
  puVar1 = &stack0xfffffffffffffee8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffed8,
             "mediump vec4 srgbToLinearCheck(in mediump vec4 texelSRGBA, in mediump vec4 texelLinear) \n{ \n\tconst int NUM_CHANNELS = 4;\tmediump vec4 texelSRGBAConverted; \n\tmediump vec4 epsilonErr = vec4(0.005); \n\tmediump vec4 testResult; \n\tfor (int idx = 0; idx < NUM_CHANNELS; idx++) \n\t{ \n\t\ttexelSRGBAConverted[idx] = pow( (texelSRGBA[idx] + 0.055) / 1.055, 1.0 / 0.4116); \n\t} \n\tif ( all(lessThan(abs(texelSRGBAConverted - texelLinear), epsilonErr)) || all(equal(texelSRGBAConverted, texelLinear)) ) \n\t{ \n\t\treturn testResult = vec4(0.0, 1.0, 0.0, 1.0); \n\t} \n\telse \n\t{ \n\t\treturn testResult = vec4(1.0, 0.0, 0.0, 1.0); \n\t} \n} \n"
             ,"");
  ComparisonFunction::ComparisonFunction
            (&local_60,(string *)local_108,(FunctionParameters)&stack0xfffffffffffffed8,in_RCX);
  if (puVar1 != &stack0xfffffffffffffee8) {
    operator_delete(puVar1,CONCAT44(uStack_114,in_stack_fffffffffffffee8) + 1);
  }
  wrapT = (WrapMode)puVar1;
  if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
  }
  paramsComparisonFunction = &local_60;
  color = (Vec4 *)&DAT_00000001;
  wrapS = CLAMP_TO_BORDER;
  FragmentShaderParameters::FragmentShaderParameters
            ((FragmentShaderParameters *)local_108,SHADEROUTPUTS_ONE,SHADERUNIFORMS_TWO,
             paramsComparisonFunction,BLENDING_NOT_REQUIRED,TOGGLING_NOT_REQUIRED);
  local_78 = 0x3e99999a3e4ccccd;
  uStack_70 = 0x3f8000003ecccccd;
  height = (int)paramsComparisonFunction;
  SRGBTestCase::addTexture
            (&this->super_SRGBTestCase,(TextureType)&local_78,0,height,color,wrapS,wrapT,
             in_stack_fffffffffffffee0,in_stack_fffffffffffffee8,in_stack_fffffffffffffef0);
  local_88 = 0x3e99999a3e4ccccd;
  uStack_80 = 0x3f8000003ecccccd;
  SRGBTestCase::addTexture
            (&this->super_SRGBTestCase,(TextureType)&local_88,2,height,color,wrapS,wrapT,
             in_stack_fffffffffffffee0,in_stack_fffffffffffffee8,in_stack_fffffffffffffef0);
  SRGBTestCase::addShaderProgram(&this->super_SRGBTestCase,(FragmentShaderParameters *)local_108);
  (this->super_SRGBTestCase).m_py = 0;
  (this->super_SRGBTestCase).m_samplingGroup = SHADERSAMPLINGGROUP_TEXTURE;
  (this->super_SRGBTestCase).m_px = 0;
  FragmentShaderParameters::~FragmentShaderParameters((FragmentShaderParameters *)local_108);
  ComparisonFunction::~ComparisonFunction(&local_60);
  return;
}

Assistant:

void GPUConversionDecodeEnabledCase::setupTest (void)
{
	// TEST STEPS:
	//	- create and set texture_a to DECODE_SKIP_EXT and texture_b to default
	//	- store textures on GPU
	//	- in fragment shader, sample both textures using texture*() and manually perform sRGB to lRGB conversion on texture_b
	//	- in fragment shader, compare converted texture_b with texture_a
	//	- render green image for pass or red for fail

	ComparisonFunction comparisonFunction("srgbToLinearCheck", FUNCTIONPARAMETERS_TWO, getFunctionDefinitionSRGBToLinearCheck());

	FragmentShaderParameters shaderParameters(SHADEROUTPUTS_ONE, SHADERUNIFORMS_TWO, &comparisonFunction, BLENDING_NOT_REQUIRED, TOGGLING_NOT_REQUIRED);

	this->addTexture(	TEXTURETYPE_2D,
						TestDimensions::WIDTH,
						TestDimensions::HEIGHT,
						getColorReferenceLinear(),
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::LINEAR,
						tcu::Sampler::LINEAR,
						SRGBDECODE_SKIP_DECODE);

	this->addTexture(	TEXTURETYPE_2D,
						TestDimensions::WIDTH,
						TestDimensions::HEIGHT,
						getColorReferenceLinear(),
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::LINEAR,
						tcu::Sampler::LINEAR,
						SRGBDECODE_DECODE_DEFAULT);

	this->addShaderProgram(shaderParameters);

	this->setSamplingLocations(TestSamplingPositions::X_POS, TestSamplingPositions::Y_POS);

	this->setSamplingGroup(SHADERSAMPLINGGROUP_TEXTURE);
}